

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall amrex::FabArray<amrex::TagBox>::~FabArray(FabArray<amrex::TagBox> *this)

{
  FabArrayBase *in_RDI;
  vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_> *unaff_retaddr;
  FabArray<amrex::TagBox> *in_stack_00000030;
  
  (((__uniq_ptr_data<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>,_true,_true>
     *)&in_RDI->_vptr_FabArrayBase)->
  super___uniq_ptr_impl<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  )._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::TagBox>_*,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::TagBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::TagBox> *)&PTR__FabArray_01803950;
  FabArrayBase::FabArrayStats::recordDelete((FabArrayStats *)FabArrayBase::m_FA_stats);
  clear(in_stack_00000030);
  std::
  unique_ptr<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::FabArray<amrex::TagBox>,_std::default_delete<amrex::FabArray<amrex::TagBox>_>_>
                 *)unaff_retaddr);
  std::unique_ptr<amrex::PCData<amrex::TagBox>,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::PCData<amrex::TagBox>,_std::default_delete<amrex::PCData<amrex::TagBox>_>_>
                 *)unaff_retaddr);
  std::unique_ptr<amrex::FBData<amrex::TagBox>,_std::default_delete<amrex::FBData<amrex::TagBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::FBData<amrex::TagBox>,_std::default_delete<amrex::FBData<amrex::TagBox>_>_>
                 *)unaff_retaddr);
  ShMem::~ShMem((ShMem *)&in_RDI[1].boxarray.m_simplified_list);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x10c715a);
  std::vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>::~vector(unaff_retaddr);
  std::
  unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
  ::~unique_ptr((unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)in_RDI);
  FabArrayBase::~FabArrayBase(in_RDI);
  return;
}

Assistant:

FabArray<FAB>::~FabArray ()
{
    m_FA_stats.recordDelete();
    clear();
}